

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

bool __thiscall cube::net::Socket::BindAndListen(Socket *this,InetAddr *addr,int backlog)

{
  int iVar1;
  sockaddr *__addr;
  socklen_t sockaddr_len;
  int backlog_local;
  InetAddr *addr_local;
  Socket *this_local;
  
  iVar1 = this->m_sockfd;
  __addr = InetAddr::SockAddr(addr);
  iVar1 = bind(iVar1,(sockaddr *)__addr,0x10);
  if (iVar1 < 0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = listen(this->m_sockfd,backlog);
    if (iVar1 < 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Socket::BindAndListen(const InetAddr &addr, int backlog) {
    socklen_t sockaddr_len = sizeof(addr.SockAddrIn());
    if (::bind(m_sockfd, addr.SockAddr(), sockaddr_len) < 0)
        return false;
    if (::listen(m_sockfd, backlog) < 0)
        return false;
    return true;
}